

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HEkkDual.cpp
# Opt level: O1

void __thiscall HEkkDual::updateFtran(HEkkDual *this)

{
  HVector *this_00;
  
  if (this->rebuild_reason != 0) {
    return;
  }
  HighsSimplexAnalysis::simplexTimerStart(this->analysis,0x42,0);
  this_00 = &this->col_aq;
  HVectorBase<double>::clear(this_00);
  (this->col_aq).packFlag = true;
  HighsSparseMatrix::collectAj(this->a_matrix,this_00,this->variable_in,1.0);
  if (this->analysis->analyse_simplex_summary_data == true) {
    HighsSimplexAnalysis::operationRecordBefore
              (this->analysis,6,this_00,(this->ekk_instance_->info_).col_aq_density);
  }
  HSimplexNla::ftran(this->simplex_nla,this_00,(this->ekk_instance_->info_).col_aq_density,
                     this->analysis->pointer_serial_factor_clocks);
  if (this->analysis->analyse_simplex_summary_data == true) {
    HighsSimplexAnalysis::operationRecordAfter(this->analysis,6,this_00);
  }
  HEkk::updateOperationResultDensity
            (this->ekk_instance_,(double)(this->col_aq).count * this->inv_solver_num_row,
             &(this->ekk_instance_->info_).col_aq_density);
  this->alpha_col =
       (this->col_aq).array.super__Vector_base<double,_std::allocator<double>_>._M_impl.
       super__Vector_impl_data._M_start[this->row_out];
  HighsSimplexAnalysis::simplexTimerStop(this->analysis,0x42,0);
  return;
}

Assistant:

void HEkkDual::updateFtran() {
  // Compute the pivotal column (FTRAN)
  //
  // If reinversion is needed then skip this method
  if (rebuild_reason) return;
  analysis->simplexTimerStart(FtranClock);
  // Clear the pivotal column and indicate that its values should be packed
  col_aq.clear();
  col_aq.packFlag = true;
  // Get the constraint matrix column by combining just one column
  // with unit multiplier
  a_matrix->collectAj(col_aq, variable_in, 1);
  if (analysis->analyse_simplex_summary_data)
    analysis->operationRecordBefore(kSimplexNlaFtran, col_aq,
                                    ekk_instance_.info_.col_aq_density);
  // Perform FTRAN
  simplex_nla->ftran(col_aq, ekk_instance_.info_.col_aq_density,
                     analysis->pointer_serial_factor_clocks);
  if (analysis->analyse_simplex_summary_data)
    analysis->operationRecordAfter(kSimplexNlaFtran, col_aq);
  const double local_col_aq_density = (double)col_aq.count * inv_solver_num_row;
  ekk_instance_.updateOperationResultDensity(
      local_col_aq_density, ekk_instance_.info_.col_aq_density);
  // Save the pivot value computed column-wise - used for numerical checking
  alpha_col = col_aq.array[row_out];
  analysis->simplexTimerStop(FtranClock);
}